

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

xmlElementContentPtr xmlCopyDocElementContent(xmlDocPtr doc,xmlElementContentPtr cur)

{
  xmlElementContentOccur xVar1;
  _xmlElementContent *p_Var2;
  xmlChar *pxVar3;
  _xmlElementContent *p_Var4;
  _xmlElementContent *p_Var5;
  _xmlElementContent *p_Var6;
  _xmlDict *dict;
  
  if (cur == (xmlElementContentPtr)0x0) {
    return (xmlElementContentPtr)0x0;
  }
  if (doc == (xmlDocPtr)0x0) {
    dict = (xmlDictPtr)0x0;
  }
  else {
    dict = doc->dict;
  }
  p_Var2 = (_xmlElementContent *)(*xmlMalloc)(0x30);
  if (p_Var2 == (_xmlElementContent *)0x0) {
    p_Var2 = (_xmlElementContent *)0x0;
    goto LAB_0018d9b3;
  }
  p_Var2->parent = (_xmlElementContent *)0x0;
  p_Var2->prefix = (xmlChar *)0x0;
  p_Var2->c1 = (_xmlElementContent *)0x0;
  p_Var2->c2 = (_xmlElementContent *)0x0;
  p_Var2->type = 0;
  p_Var2->ocur = 0;
  p_Var2->name = (xmlChar *)0x0;
  xVar1 = cur->ocur;
  p_Var2->type = cur->type;
  p_Var2->ocur = xVar1;
  pxVar3 = cur->name;
  if (pxVar3 == (xmlChar *)0x0) {
LAB_0018d993:
    pxVar3 = cur->prefix;
    if (pxVar3 != (xmlChar *)0x0) {
      if (dict == (xmlDictPtr)0x0) goto LAB_0018d9dc;
      pxVar3 = xmlDictLookup(dict,pxVar3,-1);
LAB_0018d9e4:
      p_Var2->prefix = pxVar3;
    }
  }
  else {
    if (dict != (xmlDictPtr)0x0) {
      pxVar3 = xmlDictLookup(dict,pxVar3,-1);
      p_Var2->name = pxVar3;
      goto LAB_0018d993;
    }
    pxVar3 = xmlStrdup(pxVar3);
    p_Var2->name = pxVar3;
    pxVar3 = cur->prefix;
    if (pxVar3 != (xmlChar *)0x0) {
LAB_0018d9dc:
      pxVar3 = xmlStrdup(pxVar3);
      goto LAB_0018d9e4;
    }
  }
  if (cur->c1 == (xmlElementContentPtr)0x0) {
    p_Var4 = p_Var2->c1;
  }
  else {
    p_Var4 = xmlCopyDocElementContent(doc,cur->c1);
    p_Var2->c1 = p_Var4;
  }
  if (p_Var4 != (xmlElementContentPtr)0x0) {
    p_Var4->parent = p_Var2;
  }
  p_Var4 = cur->c2;
  p_Var6 = p_Var2;
  while( true ) {
    if (p_Var4 == (_xmlElementContent *)0x0) {
      return p_Var2;
    }
    p_Var5 = (_xmlElementContent *)(*xmlMalloc)(0x30);
    if (p_Var5 == (_xmlElementContent *)0x0) break;
    p_Var5->parent = (_xmlElementContent *)0x0;
    p_Var5->prefix = (xmlChar *)0x0;
    p_Var5->c1 = (_xmlElementContent *)0x0;
    p_Var5->c2 = (_xmlElementContent *)0x0;
    p_Var5->type = 0;
    p_Var5->ocur = 0;
    p_Var5->name = (xmlChar *)0x0;
    xVar1 = p_Var4->ocur;
    p_Var5->type = p_Var4->type;
    p_Var5->ocur = xVar1;
    p_Var6->c2 = p_Var5;
    p_Var5->parent = p_Var6;
    pxVar3 = p_Var4->name;
    if (pxVar3 == (xmlChar *)0x0) {
      pxVar3 = p_Var4->prefix;
      if (pxVar3 != (xmlChar *)0x0) {
        if (dict == (xmlDictPtr)0x0) goto LAB_0018daaf;
LAB_0018da8b:
        pxVar3 = xmlDictLookup(dict,pxVar3,-1);
LAB_0018dab7:
        p_Var5->prefix = pxVar3;
      }
    }
    else if (dict == (xmlDictPtr)0x0) {
      pxVar3 = xmlStrdup(pxVar3);
      p_Var5->name = pxVar3;
      pxVar3 = p_Var4->prefix;
      if (pxVar3 != (xmlChar *)0x0) {
LAB_0018daaf:
        pxVar3 = xmlStrdup(pxVar3);
        goto LAB_0018dab7;
      }
    }
    else {
      pxVar3 = xmlDictLookup(dict,pxVar3,-1);
      p_Var5->name = pxVar3;
      pxVar3 = p_Var4->prefix;
      if (pxVar3 != (xmlChar *)0x0) goto LAB_0018da8b;
    }
    if (p_Var4->c1 == (xmlElementContentPtr)0x0) {
      p_Var6 = p_Var5->c1;
    }
    else {
      p_Var6 = xmlCopyDocElementContent(doc,p_Var4->c1);
      p_Var5->c1 = p_Var6;
    }
    if (p_Var6 != (_xmlElementContent *)0x0) {
      p_Var6->parent = p_Var2;
    }
    p_Var4 = p_Var4->c2;
    p_Var6 = p_Var5;
  }
LAB_0018d9b3:
  xmlVErrMemory((xmlValidCtxtPtr)0x0,"malloc failed");
  return p_Var2;
}

Assistant:

xmlElementContentPtr
xmlCopyDocElementContent(xmlDocPtr doc, xmlElementContentPtr cur) {
    xmlElementContentPtr ret = NULL, prev = NULL, tmp;
    xmlDictPtr dict = NULL;

    if (cur == NULL) return(NULL);

    if (doc != NULL)
        dict = doc->dict;

    ret = (xmlElementContentPtr) xmlMalloc(sizeof(xmlElementContent));
    if (ret == NULL) {
	xmlVErrMemory(NULL, "malloc failed");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlElementContent));
    ret->type = cur->type;
    ret->ocur = cur->ocur;
    if (cur->name != NULL) {
	if (dict)
	    ret->name = xmlDictLookup(dict, cur->name, -1);
	else
	    ret->name = xmlStrdup(cur->name);
    }

    if (cur->prefix != NULL) {
	if (dict)
	    ret->prefix = xmlDictLookup(dict, cur->prefix, -1);
	else
	    ret->prefix = xmlStrdup(cur->prefix);
    }
    if (cur->c1 != NULL)
        ret->c1 = xmlCopyDocElementContent(doc, cur->c1);
    if (ret->c1 != NULL)
	ret->c1->parent = ret;
    if (cur->c2 != NULL) {
        prev = ret;
	cur = cur->c2;
	while (cur != NULL) {
	    tmp = (xmlElementContentPtr) xmlMalloc(sizeof(xmlElementContent));
	    if (tmp == NULL) {
		xmlVErrMemory(NULL, "malloc failed");
		return(ret);
	    }
	    memset(tmp, 0, sizeof(xmlElementContent));
	    tmp->type = cur->type;
	    tmp->ocur = cur->ocur;
	    prev->c2 = tmp;
	    tmp->parent = prev;
	    if (cur->name != NULL) {
		if (dict)
		    tmp->name = xmlDictLookup(dict, cur->name, -1);
		else
		    tmp->name = xmlStrdup(cur->name);
	    }

	    if (cur->prefix != NULL) {
		if (dict)
		    tmp->prefix = xmlDictLookup(dict, cur->prefix, -1);
		else
		    tmp->prefix = xmlStrdup(cur->prefix);
	    }
	    if (cur->c1 != NULL)
	        tmp->c1 = xmlCopyDocElementContent(doc,cur->c1);
	    if (tmp->c1 != NULL)
		tmp->c1->parent = ret;
	    prev = tmp;
	    cur = cur->c2;
	}
    }
    return(ret);
}